

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

TheoryTerm * __thiscall
Potassco::TheoryData::addTerm(TheoryData *this,Id_t termId,Id_t funcId,IdSpan *args)

{
  TheoryTerm *pTVar1;
  IdSpan *in_RCX;
  int32_t in_ESI;
  FuncData *in_RDI;
  TheoryData *unaff_retaddr;
  TheoryTerm *in_stack_ffffffffffffffe0;
  FuncData *pFVar2;
  Id_t id;
  
  pFVar2 = in_RDI;
  FuncData::newFunc(in_ESI,in_RCX);
  id = (Id_t)((ulong)pFVar2 >> 0x20);
  TheoryTerm::TheoryTerm(in_stack_ffffffffffffffe0,in_RDI);
  pTVar1 = setTerm(unaff_retaddr,id);
  pTVar1->data_ = (uint64_t)in_stack_ffffffffffffffe0;
  return pTVar1;
}

Assistant:

const TheoryTerm& TheoryData::addTerm(Id_t termId, Id_t funcId, const IdSpan& args) {
	return setTerm(termId) = TheoryTerm(FuncData::newFunc(static_cast<int32_t>(funcId), args));
}